

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprRefToSrcList(Walker *pWalker,Expr *pExpr)

{
  RefSrcList *pRVar1;
  SrcList *pSVar2;
  bool bVar3;
  int local_40;
  int nSrc;
  SrcList *pSrc;
  RefSrcList *p;
  int i;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if ((pExpr->op == 0xa7) || (pExpr->op == 0xa9)) {
    pRVar1 = (pWalker->u).pRefSrcList;
    pSVar2 = pRVar1->pRef;
    if (pSVar2 == (SrcList *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = pSVar2->nSrc;
    }
    for (p._4_4_ = 0; p._4_4_ < local_40; p._4_4_ = p._4_4_ + 1) {
      if (pExpr->iTable == pSVar2->a[p._4_4_].iCursor) {
        pWalker->eCode = pWalker->eCode | 1;
        return 0;
      }
    }
    p._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if ((long)p._4_4_ < pRVar1->nExclude) {
        bVar3 = pRVar1->aiExclude[p._4_4_] != pExpr->iTable;
      }
      if (!bVar3) break;
      p._4_4_ = p._4_4_ + 1;
    }
    if (pRVar1->nExclude <= (long)p._4_4_) {
      pWalker->eCode = pWalker->eCode | 2;
    }
  }
  return 0;
}

Assistant:

static int exprRefToSrcList(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   || pExpr->op==TK_AGG_COLUMN
  ){
    int i;
    struct RefSrcList *p = pWalker->u.pRefSrcList;
    SrcList *pSrc = p->pRef;
    int nSrc = pSrc ? pSrc->nSrc : 0;
    for(i=0; i<nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ){
        pWalker->eCode |= 1;
        return WRC_Continue;
      }
    }
    for(i=0; i<p->nExclude && p->aiExclude[i]!=pExpr->iTable; i++){}
    if( i>=p->nExclude ){
      pWalker->eCode |= 2;
    }
  }
  return WRC_Continue;
}